

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::TSPI_PDU::SetPositionErrorFlag(TSPI_PDU *this,KBOOL F)

{
  if ((((this->m_TSPIFlagUnion).m_ui8Flag & 4) == 0) == F) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xfb | F * '\x04';
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 8 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 4;
  }
  return;
}

Assistant:

void TSPI_PDU::SetPositionErrorFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8PosErr )return;

    m_TSPIFlagUnion.m_ui8PosErr = F;

    if( F )
    {
        m_ui16PDULength += PositionError::POSITION_ERROR_SIZE;
    }
    else
    {
        m_ui16PDULength -= PositionError::POSITION_ERROR_SIZE;
    }
}